

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O0

string * __thiscall TrodesMsg::popstr_abi_cxx11_(TrodesMsg *this)

{
  char *pcVar1;
  ostream *poVar2;
  ulong in_RSI;
  string *in_RDI;
  char *str;
  string *s;
  allocator local_1a;
  undefined1 local_19;
  char *local_18;
  
  pcVar1 = (char *)std::__cxx11::string::operator[](in_RSI);
  if (*pcVar1 != 's') {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Error in TrodesMsg::popstr: First frame of msg not a string. Got ");
    pcVar1 = (char *)std::__cxx11::string::operator[](in_RSI);
    poVar2 = std::operator<<(poVar2,*pcVar1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pcVar1 = zmsg_popstr(*(zmsg_t **)(in_RSI + 0x20));
  local_19 = 0;
  local_18 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  free(local_18);
  local_18 = (char *)0x0;
  std::__cxx11::string::erase(in_RSI,1);
  return in_RDI;
}

Assistant:

std::string TrodesMsg::popstr(){
    if(format[0] != 's') {
        std::cout << "Error in TrodesMsg::popstr: First frame of msg not a string. Got " << format[0] << std::endl;
    }
    char *str = zmsg_popstr(msg);
    std::string s(str);
    freen(str);
    format.erase(1,1);
    return s;
}